

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int cvNlsResidual(N_Vector ycor,N_Vector res,void *cvode_mem)

{
  int iVar1;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDX == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x16f,"cvNlsResidual",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    N_VLinearSum(*(undefined8 *)(in_RDX + 0x60),in_RDI,*(undefined8 *)(in_RDX + 0xd0));
    iVar1 = (**(code **)(in_RDX + 0x3e0))
                      (*(undefined8 *)(in_RDX + 0x168),*(undefined8 *)(in_RDX + 0xd0),
                       *(undefined8 *)(in_RDX + 0xe8),*(undefined8 *)(in_RDX + 0x18));
    *(long *)(in_RDX + 0x360) = *(long *)(in_RDX + 0x360) + 1;
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      N_VLinearSum(*(undefined8 *)(in_RDX + 0x280),0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x68)
                   ,in_RDI,in_RSI);
      N_VLinearSum(*(ulong *)(in_RDX + 0x288) ^ 0x8000000000000000,0x3ff0000000000000,
                   *(undefined8 *)(in_RDX + 0xe8),in_RSI,in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = 10;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsResidual(N_Vector ycor, N_Vector res, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* update the state based on the current correction */
  N_VLinearSum(ONE, cv_mem->cv_zn[0], ONE, ycor, cv_mem->cv_y);

  /* evaluate the rhs function */
  retval = cv_mem->nls_f(cv_mem->cv_tn, cv_mem->cv_y, cv_mem->cv_ftemp,
                         cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) { return (CV_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
  if (cv_mem->cv_usefused)
  {
    cvNlsResid_fused(cv_mem->cv_rl1, -cv_mem->cv_gamma, cv_mem->cv_zn[1], ycor,
                     cv_mem->cv_ftemp, res);
  }
  else
#endif
  {
    N_VLinearSum(cv_mem->cv_rl1, cv_mem->cv_zn[1], ONE, ycor, res);
    N_VLinearSum(-cv_mem->cv_gamma, cv_mem->cv_ftemp, ONE, res, res);
  }

  return (CV_SUCCESS);
}